

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

TxInReference * __thiscall
cfd::TransactionController::AddTxIn
          (TxInReference *__return_storage_ptr__,TransactionController *this,Txid *txid,
          uint32_t vout,Pubkey *pubkey,uint32_t sequence)

{
  uint32_t index;
  ScriptBuilder *this_00;
  ScriptBuilder local_80;
  Script local_60;
  
  local_80._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00647848;
  local_80.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = core::ScriptBuilder::AppendData(&local_80,pubkey);
  core::ScriptBuilder::Build(&local_60,this_00);
  index = core::Transaction::AddTxIn(&this->transaction_,txid,vout,sequence,&local_60);
  core::Script::~Script(&local_60);
  core::ScriptBuilder::~ScriptBuilder(&local_80);
  core::Transaction::GetTxIn(__return_storage_ptr__,&this->transaction_,index);
  return __return_storage_ptr__;
}

Assistant:

const TxInReference TransactionController::AddTxIn(
    const Txid& txid, uint32_t vout, const Pubkey& pubkey, uint32_t sequence) {
  uint32_t index = transaction_.AddTxIn(
      txid, vout, sequence, ScriptBuilder().AppendData(pubkey).Build());
  return transaction_.GetTxIn(index);
}